

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O1

void P_SerializePlayers(FArchive *arc,bool skipload)

{
  char *__s2;
  ulong uVar1;
  undefined8 *puVar2;
  int iVar3;
  long lVar4;
  char **ppcVar5;
  undefined8 *puVar6;
  void *pvVar7;
  char **str;
  long *plVar8;
  FPlayerStart *mthing;
  ulong *puVar9;
  undefined7 in_register_00000031;
  bool bVar10;
  ulong uVar11;
  int i;
  player_t *ppVar12;
  ulong uVar13;
  undefined1 *puVar14;
  BYTE numPlayers;
  char *name;
  byte local_2fe;
  byte local_2fd;
  undefined4 local_2fc;
  ulong local_2f8;
  void *local_2f0;
  player_t *local_2e8;
  ulong *local_2e0;
  char **local_2d8;
  player_t local_2d0;
  
  local_2fc = (undefined4)CONCAT71(in_register_00000031,skipload);
  lVar4 = 0;
  local_2fe = 0;
  do {
    local_2fe = local_2fe + playeringame[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  if (arc->m_Storing == true) {
    FArchive::operator<<(arc,&local_2fe);
    lVar4 = 0;
    do {
      if (playeringame[lVar4] == true) {
        puVar2 = (undefined8 *)
                 ((ulong)(((&DAT_00a392d8)[lVar4 * 0xa8] - 1 & 0x1cf) * 0x18) +
                 (&DAT_00a392c8)[lVar4 * 0x54]);
        do {
          puVar6 = puVar2;
          puVar2 = (undefined8 *)*puVar6;
        } while (*(int *)(puVar6 + 1) != 0x1cf);
        FArchive::WriteString(arc,*(char **)(puVar6[2] + 0x28));
        player_t::Serialize((player_t *)(&players + lVar4 * 0x54),arc);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
    return;
  }
  FArchive::operator<<(arc,&local_2fd);
  uVar11 = (ulong)local_2fd;
  if (uVar11 == 1) {
    local_2d8 = (char **)0x0;
    FArchive::operator<<(arc,(char **)&local_2d8);
    ppVar12 = (player_t *)&players;
    lVar4 = 0;
    bVar10 = false;
    do {
      if (playeringame[lVar4] == true) {
        if (bVar10) {
          if (ppVar12->mo != (APlayerPawn *)0x0) {
            (*(ppVar12->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
            ppVar12->mo = (APlayerPawn *)0x0;
          }
        }
        else {
          player_t::player_t(&local_2d0);
          player_t::Serialize(&local_2d0,arc);
          if ((char)local_2fc == '\0') {
            CopyPlayer(ppVar12,&local_2d0,(char *)local_2d8);
          }
          player_t::~player_t(&local_2d0);
          bVar10 = true;
        }
      }
      lVar4 = lVar4 + 1;
      ppVar12 = ppVar12 + 1;
    } while (lVar4 != 8);
    ppcVar5 = local_2d8;
    if (local_2d8 == (char **)0x0) goto LAB_00531173;
  }
  else {
    ppcVar5 = (char **)operator_new__((ulong)((uint)local_2fd * 8));
    local_2e0 = (ulong *)operator_new__(uVar11 * 0x2a0 | 8);
    *local_2e0 = uVar11;
    ppVar12 = (player_t *)(local_2e0 + 1);
    local_2f8 = uVar11;
    local_2e8 = ppVar12;
    if (uVar11 != 0) {
      lVar4 = 0;
      do {
        player_t::player_t(ppVar12);
        lVar4 = lVar4 + -0x2a0;
        ppVar12 = ppVar12 + 1;
      } while (uVar11 * -0x2a0 - lVar4 != 0);
    }
    uVar11 = local_2f8;
    local_2f0 = operator_new__(local_2f8);
    if (uVar11 != 0) {
      uVar13 = 0;
      str = ppcVar5;
      ppVar12 = local_2e8;
      do {
        *str = (char *)0x0;
        FArchive::operator<<(arc,str);
        player_t::Serialize(ppVar12,arc);
        *(undefined1 *)((long)local_2f0 + uVar13) = 0;
        uVar13 = uVar13 + 1;
        ppVar12 = ppVar12 + 1;
        str = str + 1;
      } while (uVar11 != uVar13);
    }
    lVar4 = 0;
    do {
      *(byte *)((long)&local_2d0.mo + lVar4) = (playeringame[lVar4] ^ 1U) * '\x02';
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
    puVar9 = local_2e0;
    pvVar7 = local_2f0;
    if ((char)local_2fc == '\0') {
      if ((char)uVar11 != '\0') {
        uVar11 = 0;
        do {
          uVar13 = 0;
          do {
            if (*(char *)((long)&local_2d0.mo + uVar13) == '\0') {
              puVar2 = (undefined8 *)
                       ((ulong)(((&DAT_00a392d8)[uVar13 * 0xa8] - 1 & 0x1cf) * 0x18) +
                       (&DAT_00a392c8)[uVar13 * 0x54]);
              do {
                puVar6 = puVar2;
                puVar2 = (undefined8 *)*puVar6;
              } while (*(int *)(puVar6 + 1) != 0x1cf);
              __s2 = ppcVar5[uVar11];
              iVar3 = strcasecmp(*(char **)(puVar6[2] + 0x28),__s2);
              if (iVar3 == 0) {
                Printf("Found player %d (%s) at %d\n",uVar11 & 0xffffffff,__s2,uVar13 & 0xffffffff);
                CopyPlayer((player_t *)(&players + uVar13 * 0x54),local_2e8 + uVar11,ppcVar5[uVar11]
                          );
                *(undefined1 *)((long)&local_2d0.mo + uVar13) = 1;
                *(undefined1 *)((long)local_2f0 + uVar11) = 1;
                break;
              }
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 != 8);
          uVar11 = uVar11 + 1;
        } while (uVar11 != local_2f8);
        if ((char)local_2f8 != '\0') {
          uVar11 = 0;
          pvVar7 = local_2f0;
          do {
            if (*(char *)((long)pvVar7 + uVar11) == '\0') {
              ppVar12 = (player_t *)&players;
              uVar13 = 0;
LAB_00531000:
              if (*(char *)((long)&local_2d0.mo + uVar13) != '\0') goto code_r0x00531007;
              puVar2 = (undefined8 *)
                       ((long)&((ppVar12->userinfo).
                                super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                               .Nodes)->Next +
                       (ulong)(((ppVar12->userinfo).
                                super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                                .Size - 1 & 0x1cf) * 0x18));
              do {
                puVar6 = puVar2;
                puVar2 = (undefined8 *)*puVar6;
              } while (*(int *)(puVar6 + 1) != 0x1cf);
              Printf("Assigned player %d (%s) to %d (%s)\n",uVar11 & 0xffffffff,ppcVar5[uVar11],
                     uVar13 & 0xffffffff,*(undefined8 *)(puVar6[2] + 0x28));
              CopyPlayer(ppVar12,local_2e8 + uVar11,ppcVar5[uVar11]);
              *(undefined1 *)((long)&local_2d0.mo + uVar13) = 1;
              *(undefined1 *)((long)local_2f0 + uVar11) = 1;
              pvVar7 = local_2f0;
            }
LAB_00531082:
            uVar11 = uVar11 + 1;
          } while (uVar11 != local_2f8);
        }
      }
      puVar9 = local_2e0;
      ppVar12 = local_2e8;
      uVar11 = local_2f8;
      plVar8 = &players;
      lVar4 = 0;
      do {
        if ((*(char *)((long)&local_2d0.mo + lVar4) == '\0') && ((long *)*plVar8 != (long *)0x0)) {
          (**(code **)(*(long *)*plVar8 + 0x20))();
          *plVar8 = 0;
        }
        lVar4 = lVar4 + 1;
        plVar8 = plVar8 + 0x54;
      } while (lVar4 != 8);
      pvVar7 = local_2f0;
      if ((char)uVar11 != '\0') {
        uVar13 = 0;
        do {
          if (*(char *)((long)pvVar7 + uVar13) == '\0') {
            (*(ppVar12->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
            ppVar12->mo = (APlayerPawn *)0x0;
            pvVar7 = local_2f0;
          }
          uVar13 = uVar13 + 1;
          ppVar12 = ppVar12 + 1;
        } while (uVar11 != uVar13);
      }
    }
    operator_delete__(pvVar7);
    lVar4 = *puVar9 * 0x2a0;
    uVar13 = lVar4 + 8;
    uVar1 = *puVar9;
    while (uVar1 != 0) {
      player_t::~player_t((player_t *)((long)puVar9 + lVar4 + -0x298));
      lVar4 = lVar4 + -0x2a0;
      uVar1 = lVar4;
    }
    operator_delete__(puVar9,uVar13);
    if ((char)uVar11 != '\0') {
      uVar13 = 0;
      do {
        if (ppcVar5[uVar13] != (char *)0x0) {
          operator_delete__(ppcVar5[uVar13]);
        }
        uVar13 = uVar13 + 1;
      } while (uVar11 != uVar13);
    }
  }
  operator_delete__(ppcVar5);
LAB_00531173:
  if ((((char)local_2fc == '\0') && (local_2fd < local_2fe)) && (deathmatch.Value == 0)) {
    puVar14 = &DAT_00a39298;
    mthing = playerstarts;
    lVar4 = 0;
    do {
      if ((playeringame[lVar4] == true) && (*(long *)(puVar14 + -8) == 0)) {
        *puVar14 = 3;
        P_SpawnPlayer(mthing,(int)lVar4,level.flags2 >> 6 & 2);
      }
      lVar4 = lVar4 + 1;
      mthing = mthing + 1;
      puVar14 = puVar14 + 0x2a0;
    } while (lVar4 != 8);
  }
  player_t::SendPitchLimits((player_t *)(&players + (long)consoleplayer * 0x54));
  return;
code_r0x00531007:
  uVar13 = uVar13 + 1;
  ppVar12 = ppVar12 + 1;
  if (uVar13 == 8) goto LAB_00531082;
  goto LAB_00531000;
}

Assistant:

void P_SerializePlayers (FArchive &arc, bool skipload)
{
	BYTE numPlayers, numPlayersNow;
	int i;

	// Count the number of players present right now.
	for (numPlayersNow = 0, i = 0; i < MAXPLAYERS; ++i)
	{
		if (playeringame[i])
		{
			++numPlayersNow;
		}
	}

	if (arc.IsStoring())
	{
		// Record the number of players in this save.
		arc << numPlayersNow;

		// Record each player's name, followed by their data.
		for (i = 0; i < MAXPLAYERS; ++i)
		{
			if (playeringame[i])
			{
				arc.WriteString (players[i].userinfo.GetName());
				players[i].Serialize (arc);
			}
		}
	}
	else
	{
		arc << numPlayers;

		// If there is only one player in the game, they go to the
		// first player present, no matter what their name.
		if (numPlayers == 1)
		{
			ReadOnePlayer (arc, skipload);
		}
		else
		{
			ReadMultiplePlayers (arc, numPlayers, numPlayersNow, skipload);
		}
		if (!skipload && numPlayersNow > numPlayers)
		{
			SpawnExtraPlayers ();
		}
		// Redo pitch limits, since the spawned player has them at 0.
		players[consoleplayer].SendPitchLimits();
	}
}